

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

int net_tcp_send(NETSOCKET sock,void *data,int size)

{
  int iVar1;
  ssize_t sVar2;
  
  if (sock._0_8_ < 0) {
    iVar1 = -1;
  }
  else {
    sVar2 = send(sock.ipv4sock,data,(long)size,0);
    iVar1 = (int)sVar2;
  }
  if (-1 < sock.ipv6sock) {
    sVar2 = send(sock.ipv6sock,data,(long)size,0);
    iVar1 = (int)sVar2;
  }
  return iVar1;
}

Assistant:

int net_tcp_send(NETSOCKET sock, const void *data, int size)
{
	int bytes = -1;

	if(sock.ipv4sock >= 0)
		bytes = send((int)sock.ipv4sock, (const char*)data, size, 0);
	if(sock.ipv6sock >= 0)
		bytes = send((int)sock.ipv6sock, (const char*)data, size, 0);

	return bytes;
}